

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O1

QRect __thiscall QRect::operator&(QRect *this,QRect *r)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  QRect QVar17;
  
  uVar12 = 0xffffffff00000000;
  uVar13 = 0xffffffff;
  uVar4 = (this->x1).m_i;
  uVar5 = (this->y1).m_i;
  uVar1 = uVar4 - 1;
  uVar2 = uVar5 - 1;
  uVar6 = (this->x2).m_i;
  uVar7 = (this->y2).m_i;
  if (uVar7 == uVar2 && uVar6 == uVar1) {
    uVar15 = 0;
    uVar14 = 0;
  }
  else {
    uVar8 = (r->x1).m_i;
    uVar9 = (r->y1).m_i;
    uVar16 = uVar8 - 1;
    uVar3 = uVar9 - 1;
    uVar10 = (r->x2).m_i;
    uVar11 = (r->y2).m_i;
    if (uVar11 != uVar3 || uVar10 != uVar16) {
      if ((int)uVar6 < (int)uVar1) {
        uVar4 = uVar6 + 1;
      }
      if ((int)uVar1 < (int)uVar6) {
        uVar1 = uVar6;
      }
      if ((int)uVar10 < (int)uVar16) {
        uVar8 = uVar10 + 1;
      }
      if ((int)uVar16 < (int)uVar10) {
        uVar16 = uVar10;
      }
      if ((int)uVar8 <= (int)uVar1 && (int)uVar4 <= (int)uVar16) {
        if ((int)uVar7 < (int)uVar2) {
          uVar5 = uVar7 + 1;
        }
        if ((int)uVar2 < (int)uVar7) {
          uVar2 = uVar7;
        }
        if ((int)uVar11 < (int)uVar3) {
          uVar9 = uVar11 + 1;
        }
        if ((int)uVar3 < (int)uVar11) {
          uVar3 = uVar11;
        }
        uVar15 = 0;
        if ((int)uVar5 <= (int)uVar3) {
          uVar14 = 0;
          uVar12 = 0xffffffff00000000;
          if ((int)uVar9 <= (int)uVar2) {
            if ((int)uVar8 < (int)uVar4) {
              uVar8 = uVar4;
            }
            uVar15 = (ulong)uVar8;
            if ((int)uVar1 < (int)uVar16) {
              uVar16 = uVar1;
            }
            uVar13 = (ulong)uVar16;
            if ((int)uVar9 < (int)uVar5) {
              uVar9 = uVar5;
            }
            if ((int)uVar2 < (int)uVar3) {
              uVar3 = uVar2;
            }
            uVar14 = (ulong)uVar9 << 0x20;
            uVar12 = (ulong)uVar3 << 0x20;
          }
          goto LAB_0038f2e0;
        }
      }
    }
    uVar15 = 0;
    uVar14 = 0;
    uVar12 = 0xffffffff00000000;
  }
LAB_0038f2e0:
  QVar17._8_8_ = uVar13 | uVar12;
  QVar17._0_8_ = uVar15 | uVar14;
  return QVar17;
}

Assistant:

QRect QRect::operator&(const QRect &r) const noexcept
{
    if (isNull() || r.isNull())
        return QRect();

    Representation l1 = x1;
    Representation r1 = x2;
    if (x2 < x1 - 1) {
        l1 = x2 + 1;
        r1 = x1 - 1;
    }

    Representation l2 = r.x1;
    Representation r2 = r.x2;
    if (r.x2 < r.x1 - 1) {
        l2 = r.x2 + 1;
        r2 = r.x1 - 1;
    }

    if (l1 > r2 || l2 > r1)
        return QRect();

    Representation t1 = y1;
    Representation b1 = y2;
    if (y2 < y1 - 1) {
        t1 = y2 + 1;
        b1 = y1 - 1;
    }

    Representation t2 = r.y1;
    Representation b2 = r.y2;
    if (r.y2 < r.y1 - 1) {
        t2 = r.y2 + 1;
        b2 = r.y1 - 1;
    }

    if (t1 > b2 || t2 > b1)
        return QRect();

    QRect tmp;
    tmp.x1 = qMax(l1, l2);
    tmp.x2 = qMin(r1, r2);
    tmp.y1 = qMax(t1, t2);
    tmp.y2 = qMin(b1, b2);
    return tmp;
}